

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlc.c
# Opt level: O1

TA_RetCode
rangeTestFunction(TA_Integer startIdx,TA_Integer endIdx,TA_Real *outputBuffer,
                 TA_Integer *outputBufferInt,TA_Integer *outBegIdx,TA_Integer *outNbElement,
                 TA_Integer *lookback,void *opaqueData,uint outputNb,uint *isOutputInteger)

{
  TA_RetCode TVar1;
  int iVar2;
  
  *isOutputInteger = 0;
  if (*(int *)(*opaqueData + 0x10) == 0) {
    TVar1 = TA_TRANGE(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                      *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                      outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_TRANGE_Lookback();
  }
  else {
    TVar1 = TA_ATR(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                   *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                   *(int *)(*opaqueData + 0x14),outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_ATR_Lookback(*(int *)(*opaqueData + 0x14));
  }
  *lookback = iVar2;
  return TVar1;
}

Assistant:

static TA_RetCode rangeTestFunction( TA_Integer    startIdx,
                                     TA_Integer    endIdx,
                                     TA_Real      *outputBuffer,
                                     TA_Integer   *outputBufferInt,
                                     TA_Integer   *outBegIdx,
                                     TA_Integer   *outNbElement,
                                     TA_Integer   *lookback,
                                     void         *opaqueData,
                                     unsigned int  outputNb,
                                     unsigned int *isOutputInteger )
{
   TA_RetCode retCode;
   TA_RangeTestParam *testParam;
   TA_Real *dummyBuffer1, *dummyBuffer2;
   TA_Real *out1, *out2, *out3;

   (void)outputBufferInt;

   *isOutputInteger = 0;

   testParam = (TA_RangeTestParam *)opaqueData;

   if( testParam->test->theFunction != TA_ACCBANDS_TEST )
   {
	   out1 = out2 = out3 = NULL;
	   dummyBuffer1 = NULL;
	   dummyBuffer2 = NULL;
   }
   else
   {
	   dummyBuffer1 = TA_Malloc( ((endIdx-startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer1 )
		 return TA_ALLOC_ERR;

	   dummyBuffer2 = TA_Malloc( ((endIdx-startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer2 )
	   {
		  TA_Free( dummyBuffer1 );
		  return TA_ALLOC_ERR;
	   }

	   switch( outputNb )
	   {
	   case 0:
		  out1 = outputBuffer;
		  out2 = dummyBuffer1;
		  out3 = dummyBuffer2;
		  break;
	   case 1:
		  out2 = outputBuffer;
		  out1 = dummyBuffer1;
		  out3 = dummyBuffer2;
		  break;
	   case 2:
		  out3 = outputBuffer;
		  out2 = dummyBuffer1;
		  out1 = dummyBuffer2;
		  break;
	   default:
		  TA_Free( dummyBuffer1 );
		  TA_Free( dummyBuffer2 );
		  return TA_BAD_PARAM;
	   }
   }

   switch( testParam->test->theFunction )
   {
   case TA_NATR_TEST:
      retCode = TA_NATR( startIdx,
                         endIdx,
                         testParam->high,
                         testParam->low,
                         testParam->close,
                         testParam->test->optInTimePeriod1,
                         outBegIdx,
                         outNbElement,
                         outputBuffer );
      *lookback = TA_NATR_Lookback( testParam->test->optInTimePeriod1 );
      break;

   case TA_CCI_TEST:
      retCode = TA_CCI( startIdx,
                        endIdx,
                        testParam->high,
                        testParam->low,
                        testParam->close,
                        testParam->test->optInTimePeriod1,
                        outBegIdx,
                        outNbElement,
                        outputBuffer );
      *lookback = TA_CCI_Lookback( testParam->test->optInTimePeriod1 );
      break;
   case TA_WILLR_TEST:
      retCode = TA_WILLR( startIdx,
                          endIdx,
                          testParam->high,
                          testParam->low,
                          testParam->close,
                          testParam->test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          outputBuffer );
      *lookback = TA_WILLR_Lookback( testParam->test->optInTimePeriod1 );
      break;

   case TA_ULTOSC_TEST:
      retCode = TA_ULTOSC( startIdx,
                           endIdx,
                           testParam->high,
                           testParam->low,
                           testParam->close,
                           testParam->test->optInTimePeriod1,
                           testParam->test->optInTimePeriod2,
                           testParam->test->optInTimePeriod3,
                           outBegIdx,
                           outNbElement,
                           outputBuffer );
      *lookback = TA_ULTOSC_Lookback( testParam->test->optInTimePeriod1,
                                      testParam->test->optInTimePeriod2,
                                      testParam->test->optInTimePeriod3 );
      break;
   case TA_ACCBANDS_TEST:
      retCode = TA_ACCBANDS( startIdx,
                          endIdx,
                          testParam->high,
                          testParam->low,
                          testParam->close,
                          testParam->test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          out1, out2, out3 );
      *lookback = TA_ACCBANDS_Lookback( testParam->test->optInTimePeriod1 );
	  break;

   default:
      retCode = TA_INTERNAL_ERROR(132);
   }

   FREE_IF_NOT_NULL( dummyBuffer1 );
   FREE_IF_NOT_NULL( dummyBuffer2 );
   return retCode;
}